

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O3

base_learner * oaa_setup(options_i *options,vw *all)

{
  uint64_t *initial;
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  uint32_t uVar3;
  namedlabels *pnVar4;
  uint32_t *puVar5;
  parser *ppVar6;
  vw *pvVar7;
  int iVar8;
  oaa *dat;
  option_group_definition *poVar9;
  polyprediction *ppVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  base_learner *l;
  single_learner *base;
  learner<oaa,_example> *plVar14;
  ostream *poVar15;
  vw_exception *this;
  long lVar16;
  undefined **ppuVar17;
  label_parser *plVar18;
  long lVar19;
  uint64_t *location;
  byte bVar20;
  float fVar21;
  bool scores;
  bool probabilities;
  size_type __dnew_4;
  option_group_definition new_options;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  size_type __dnew;
  bool local_7aa;
  bool local_7a9;
  vw *local_7a8;
  options_i *local_7a0;
  _func_int ***local_798;
  _func_int **local_790;
  _func_int **local_788 [2];
  long local_778;
  _func_int ***local_770;
  _func_int **local_768;
  _func_int **local_760 [2];
  _func_int ***local_750;
  _func_int **local_748;
  _func_int **local_740 [2];
  _func_int ***local_730;
  _func_int **local_728;
  _func_int **local_720 [2];
  string local_710;
  string local_6f0;
  option_group_definition local_6d0;
  long *local_698;
  long local_690;
  long local_688 [2];
  string local_678;
  string local_658;
  string local_638;
  undefined1 local_618 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_590;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_580;
  undefined1 local_578 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  undefined1 local_4d8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  undefined1 local_438 [48];
  string local_408 [64];
  bool local_3c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  typed_option<bool> local_2b0;
  typed_option<bool> local_210;
  typed_option<unsigned_long> local_170;
  typed_option<unsigned_long> local_d0;
  
  bVar20 = 0;
  local_7a0 = options;
  dat = calloc_or_throw<oaa>(1);
  dat->k = 0;
  dat->all = (vw *)0x0;
  dat->pred = (polyprediction *)0x0;
  dat->num_subsample = 0;
  dat->subsample_order = (uint32_t *)0x0;
  dat->subsample_id = 0;
  local_7a9 = false;
  local_7aa = false;
  local_438._0_8_ = (_func_int **)0x17;
  local_798 = local_788;
  local_798 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_798,(ulong)local_438);
  local_788[0] = (_func_int **)local_438._0_8_;
  *(undefined4 *)local_798 = 0x20656e4f;
  builtin_strncpy((char *)((long)local_798 + 4),"Agai",4);
  *(undefined4 *)(local_798 + 1) = 0x2074736e;
  builtin_strncpy((char *)((long)local_798 + 0xc),"All ",4);
  builtin_strncpy((char *)((long)local_798 + 0xf)," Options",8);
  local_790 = (_func_int **)local_438._0_8_;
  *(char *)((long)local_798 + local_438._0_8_) = '\0';
  local_6d0.m_name._M_dataplus._M_p = (pointer)&local_6d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6d0,local_798,(char *)(local_438._0_8_ + (long)local_798));
  local_6d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_798 != local_788) {
    operator_delete(local_798);
  }
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  local_6f0.field_2._M_allocated_capacity._0_4_ = 0x61616f;
  local_6f0._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_438,&local_6f0,&dat->k);
  local_3c8 = true;
  local_730 = local_720;
  local_4d8._0_8_ = (_func_int **)0x2a;
  local_730 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_730,(ulong)local_4d8);
  local_720[0] = (_func_int **)local_4d8._0_8_;
  builtin_strncpy((char *)((long)local_730 + 0x1a)," with <k",8);
  builtin_strncpy((char *)((long)local_730 + 0x22),"> labels",8);
  local_730[2] = (_func_int **)0x616c6369746c756d;
  local_730[3] = (_func_int **)0x2068746977207373;
  *local_730 = (_func_int **)0x696167612d656e4f;
  local_730[1] = (_func_int **)0x206c6c612d74736e;
  local_728 = (_func_int **)local_4d8._0_8_;
  *(char *)((long)local_730 + local_4d8._0_8_) = '\0';
  std::__cxx11::string::_M_assign(local_408);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,(typed_option<unsigned_long> *)local_438);
  poVar9 = VW::config::option_group_definition::add<unsigned_long>(&local_6d0,&local_d0);
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  local_710.field_2._M_allocated_capacity._0_5_ = 0x735f61616f;
  local_710.field_2._M_allocated_capacity._5_3_ = 0x736275;
  local_710.field_2._8_5_ = 0x656c706d61;
  local_710._M_string_length = 0xd;
  local_710.field_2._M_local_buf[0xd] = '\0';
  location = &dat->num_subsample;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_4d8,&local_710,location);
  local_750 = local_740;
  local_578._0_8_ = (_func_int **)0x38;
  local_750 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_750,(ulong)local_578);
  local_740[0] = (_func_int **)local_578._0_8_;
  local_750[4] = (_func_int **)0x6c706d6178652065;
  local_750[5] = (_func_int **)0x206e656877207365;
  local_750[2] = (_func_int **)0x666f207265626d75;
  local_750[3] = (_func_int **)0x7669746167656e20;
  *local_750 = (_func_int **)0x6c706d6173627573;
  local_750[1] = (_func_int **)0x6e20736968742065;
  local_750[6] = (_func_int **)0x676e696e7261656c;
  local_748 = (_func_int **)local_578._0_8_;
  *(char *)((long)local_750 + local_578._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_4d8 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_170,(typed_option<unsigned_long> *)local_4d8);
  poVar9 = VW::config::option_group_definition::add<unsigned_long>(poVar9,&local_170);
  local_658.field_2._M_allocated_capacity._0_5_ = 0x61626f7270;
  local_658.field_2._M_allocated_capacity._5_3_ = 0x6c6962;
  local_658.field_2._8_5_ = 0x7365697469;
  local_658._M_string_length = 0xd;
  local_658.field_2._M_local_buf[0xd] = '\0';
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_578,&local_658,&local_7a9);
  local_770 = local_760;
  local_618._0_8_ = (_func_int **)0x23;
  local_770 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_770,(ulong)local_618);
  local_760[0] = (_func_int **)local_618._0_8_;
  local_770[2] = (_func_int **)0x20666f2073657469;
  local_770[3] = (_func_int **)0x73616c63206c6c61;
  *local_770 = (_func_int **)0x2074636964657270;
  local_770[1] = (_func_int **)0x6c696261626f7270;
  builtin_strncpy((char *)((long)local_770 + 0x1f),"sses",4);
  local_768 = (_func_int **)local_618._0_8_;
  *(char *)((long)local_770 + local_618._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_578 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_578);
  local_7a8 = all;
  poVar9 = VW::config::option_group_definition::add<bool>(poVar9,&local_210);
  local_678.field_2._M_allocated_capacity._0_4_ = 0x726f6373;
  local_678.field_2._M_allocated_capacity._4_2_ = 0x7365;
  local_678._M_string_length = 6;
  local_678.field_2._M_local_buf[6] = '\0';
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_618,&local_678,&local_7aa);
  local_778 = 0x1b;
  local_698 = local_688;
  local_698 = (long *)std::__cxx11::string::_M_create((ulong *)&local_698,(ulong)&local_778);
  local_688[0] = local_778;
  builtin_strncpy((char *)((long)local_698 + 0xb),"scores p",8);
  builtin_strncpy((char *)((long)local_698 + 0x13),"er class",8);
  *local_698 = 0x722074757074756f;
  local_698[1] = 0x65726f6373207761;
  local_690 = local_778;
  *(char *)((long)local_698 + local_778) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_618 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_618);
  VW::config::option_group_definition::add<bool>(poVar9,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce110;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_698 != local_688) {
    operator_delete(local_698);
  }
  local_618._0_8_ = &PTR__typed_option_002ce110;
  if (local_580._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_580._M_pi);
  }
  if (local_590._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_590._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce110;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_770 != local_760) {
    operator_delete(local_770);
  }
  local_578._0_8_ = &PTR__typed_option_002ce110;
  if (local_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4e0._M_pi);
  }
  if (local_4f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce070;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_750 != local_740) {
    operator_delete(local_750);
  }
  local_4d8._0_8_ = &PTR__typed_option_002ce070;
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440._M_pi);
  }
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce070;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_730 != local_720) {
    operator_delete(local_730);
  }
  local_438._0_8_ = &PTR__typed_option_002ce070;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p);
  }
  (**local_7a0->_vptr_options_i)(local_7a0,&local_6d0);
  pp_Var2 = (_func_int **)(local_438 + 0x10);
  local_438._16_4_ = 0x61616f;
  local_438._8_8_ = (pointer)0x3;
  local_438._0_8_ = pp_Var2;
  iVar8 = (*local_7a0->_vptr_options_i[1])(local_7a0,local_438);
  if ((_func_int **)local_438._0_8_ != pp_Var2) {
    operator_delete((void *)local_438._0_8_);
  }
  if ((char)iVar8 == '\0') {
    plVar14 = (learner<oaa,_example> *)0x0;
  }
  else {
    pnVar4 = local_7a8->sd->ldict;
    if ((pnVar4 != (namedlabels *)0x0) && (dat->k != (ulong)pnVar4->K)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_438 + 0x10),"error: you have ",0x10);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)(local_438 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15," named labels; use that as the argument to oaa",0x2e);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/oaa.cc"
                 ,0xdf,&local_638);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    dat->all = local_7a8;
    ppVar10 = calloc_or_throw<polyprediction>(dat->k);
    dat->pred = ppVar10;
    dat->subsample_order = (uint32_t *)0x0;
    dat->subsample_id = 0;
    if (dat->num_subsample != 0) {
      if (dat->num_subsample < dat->k) {
        puVar11 = calloc_or_throw<unsigned_int>(dat->k);
        dat->subsample_order = puVar11;
        if (dat->k != 0) {
          uVar12 = 0;
          do {
            dat->subsample_order[uVar12] = (uint32_t)uVar12;
            uVar12 = uVar12 + 1;
          } while (uVar12 < dat->k);
          if (dat->k != 0) {
            initial = &local_7a8->random_state;
            lVar19 = 0;
            uVar12 = 0;
            do {
              fVar21 = merand48(initial);
              fVar21 = fVar21 * (float)(dat->k + lVar19);
              uVar13 = (ulong)fVar21;
              lVar16 = ((long)(fVar21 - 9.223372e+18) & (long)uVar13 >> 0x3f | uVar13) + uVar12;
              puVar5 = dat->subsample_order;
              uVar3 = puVar5[uVar12];
              puVar5[uVar12] = puVar5[lVar16];
              dat->subsample_order[lVar16] = uVar3;
              uVar12 = uVar12 + 1;
              lVar19 = lVar19 + -1;
            } while (uVar12 < dat->k);
          }
        }
      }
      else {
        *location = 0;
        pvVar1 = &local_7a8->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,
                   "oaa is turning off subsampling because your parameter >= K",0x3a);
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
    }
    pvVar7 = local_7a8;
    l = setup_base(local_7a0,local_7a8);
    base = LEARNER::as_singleline<char,char>(l);
    if (local_7a9 == false) {
      if (local_7aa == false) {
        ppVar6 = pvVar7->p;
        if (pvVar7->raw_prediction < 1) {
          plVar14 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                              (dat,base,predict_or_learn<true,false,false,false>,
                               predict_or_learn<false,false,false,false>,dat->k,multiclass);
        }
        else {
          plVar14 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                              (dat,base,predict_or_learn<true,true,false,false>,
                               predict_or_learn<false,true,false,false>,dat->k,multiclass);
        }
        *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
        *(code **)(plVar14 + 0x68) = MULTICLASS::finish_example<oaa>;
        ppuVar17 = &MULTICLASS::mc_label;
        plVar18 = &ppVar6->lp;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          plVar18->default_label = (_func_void_void_ptr *)*ppuVar17;
          ppuVar17 = ppuVar17 + (ulong)bVar20 * -2 + 1;
          plVar18 = (label_parser *)((long)plVar18 + (ulong)bVar20 * -0x10 + 8);
        }
      }
      else {
        pvVar7->delete_prediction = delete_scalars;
        ppVar6 = pvVar7->p;
        plVar14 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                            (dat,base,predict_or_learn<true,false,true,false>,
                             predict_or_learn<false,false,true,false>,dat->k,scalars);
        ppuVar17 = &MULTICLASS::mc_label;
        plVar18 = &ppVar6->lp;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          plVar18->default_label = (_func_void_void_ptr *)*ppuVar17;
          ppuVar17 = ppuVar17 + (ulong)bVar20 * -2 + 1;
          plVar18 = (label_parser *)((long)plVar18 + (ulong)bVar20 * -0x10 + 8);
        }
        *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
        *(code **)(plVar14 + 0x68) = finish_example_scores<false>;
      }
    }
    else {
      pvVar7->delete_prediction = delete_scalars;
      (**pvVar7->loss->_vptr_loss_function)(local_438);
      iVar8 = std::__cxx11::string::compare(local_438);
      if (iVar8 != 0) {
        pvVar1 = &pvVar7->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,
                   "WARNING: --probabilities should be used only with --loss_function=logistic",0x4a
                  );
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
      ppVar6 = pvVar7->p;
      plVar14 = LEARNER::learner<oaa,example>::init_learner<LEARNER::learner<char,example>>
                          (dat,base,predict_or_learn<true,false,true,true>,
                           predict_or_learn<false,false,true,true>,dat->k,scalars);
      *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
      *(code **)(plVar14 + 0x68) = MULTICLASS::finish_example<oaa>;
      ppuVar17 = &MULTICLASS::mc_label;
      plVar18 = &ppVar6->lp;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        plVar18->default_label = (_func_void_void_ptr *)*ppuVar17;
        ppuVar17 = ppuVar17 + (ulong)bVar20 * -2 + 1;
        plVar18 = (label_parser *)((long)plVar18 + (ulong)bVar20 * -0x10 + 8);
      }
      pvVar7->sd->report_multiclass_log_loss = true;
      *(undefined8 *)(plVar14 + 0x58) = *(undefined8 *)(plVar14 + 0x18);
      *(code **)(plVar14 + 0x68) = finish_example_scores<true>;
      if ((_func_int **)local_438._0_8_ != pp_Var2) {
        operator_delete((void *)local_438._0_8_);
      }
    }
    if (*location != 0) {
      *(code **)(plVar14 + 0x28) = learn_randomized;
    }
    *(undefined8 *)(plVar14 + 0xb8) = *(undefined8 *)(plVar14 + 0x18);
    *(undefined8 *)(plVar14 + 0xc0) = *(undefined8 *)(plVar14 + 0x20);
    *(code **)(plVar14 + 200) = finish;
    dat = (oaa *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_6d0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0.m_name._M_dataplus._M_p != &local_6d0.m_name.field_2) {
    operator_delete(local_6d0.m_name._M_dataplus._M_p);
  }
  if (dat != (oaa *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar14;
}

Assistant:

LEARNER::base_learner* oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<oaa>();
  bool probabilities = false;
  bool scores = false;
  option_group_definition new_options("One Against All Options");
  new_options.add(make_option("oaa", data->k).keep().help("One-against-all multiclass with <k> labels"))
      .add(make_option("oaa_subsample", data->num_subsample)
               .help("subsample this number of negative examples when learning"))
      .add(make_option("probabilities", probabilities).help("predict probabilites of all classes"))
      .add(make_option("scores", scores).help("output raw scores per class"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("oaa"))
    return nullptr;

  if (all.sd->ldict && (data->k != all.sd->ldict->getK()))
    THROW("error: you have " << all.sd->ldict->getK() << " named labels; use that as the argument to oaa")

  data->all = &all;
  data->pred = calloc_or_throw<polyprediction>(data->k);
  data->subsample_order = nullptr;
  data->subsample_id = 0;
  if (data->num_subsample > 0)
  {
    if (data->num_subsample >= data->k)
    {
      data->num_subsample = 0;
      all.trace_message << "oaa is turning off subsampling because your parameter >= K" << endl;
    }
    else
    {
      data->subsample_order = calloc_or_throw<uint32_t>(data->k);
      for (size_t i = 0; i < data->k; i++) data->subsample_order[i] = (uint32_t)i;
      for (size_t i = 0; i < data->k; i++)
      {
        size_t j = (size_t)(merand48(all.random_state) * (float)(data->k - i)) + i;
        uint32_t tmp = data->subsample_order[i];
        data->subsample_order[i] = data->subsample_order[j];
        data->subsample_order[j] = tmp;
      }
    }
  }

  oaa* data_ptr = data.get();
  LEARNER::learner<oaa, example>* l;
  auto base = as_singleline(setup_base(options, all));
  if (probabilities || scores)
  {
    all.delete_prediction = delete_scalars;
    if (probabilities)
    {
      auto loss_function_type = all.loss->getType();
      if (loss_function_type != "logistic")
        all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
      // the three boolean template parameters are: is_learn, print_all and scores
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, true>,
          predict_or_learn<false, false, true, true>, all.p, data->k, prediction_type::scalars);
      all.sd->report_multiclass_log_loss = true;
      l->set_finish_example(finish_example_scores<true>);
    }
    else
    {
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, false>,
          predict_or_learn<false, false, true, false>, all.p, data->k, prediction_type::scalars);
      l->set_finish_example(finish_example_scores<false>);
    }
  }
  else if (all.raw_prediction > 0)
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, true, false, false>,
        predict_or_learn<false, true, false, false>, all.p, data->k, prediction_type::multiclass);
  else
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, false, false>,
        predict_or_learn<false, false, false, false>, all.p, data->k, prediction_type::multiclass);

  if (data_ptr->num_subsample > 0)
    l->set_learn(learn_randomized);
  l->set_finish(finish);

  return make_base(*l);
}